

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O2

int __thiscall btMultiBodyJointMotor::getIslandIdB(btMultiBodyJointMotor *this)

{
  uint uVar1;
  btMultiBody *pbVar2;
  ulong uVar3;
  ulong uVar4;
  btMultiBodyLinkCollider *pbVar5;
  
  pbVar2 = (this->super_btMultiBodyConstraint).m_bodyB;
  pbVar5 = pbVar2->m_baseCollider;
  if (pbVar5 == (btMultiBodyLinkCollider *)0x0) {
    uVar1 = (pbVar2->m_links).m_size;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    uVar4 = 0;
    do {
      if (uVar3 * 600 + 600 == uVar4 + 600) {
        return -1;
      }
      pbVar5 = *(btMultiBodyLinkCollider **)
                ((long)((pbVar2->m_links).m_data)->m_jointTorque + uVar4 + 0x1c);
      uVar4 = uVar4 + 600;
    } while (pbVar5 == (btMultiBodyLinkCollider *)0x0);
  }
  return *(int *)(pbVar5 + 0xe4);
}

Assistant:

int btMultiBodyJointMotor::getIslandIdB() const
{
	btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
	if (col)
		return col->getIslandTag();

	for (int i=0;i<m_bodyB->getNumLinks();i++)
	{
		col = m_bodyB->getLink(i).m_collider;
		if (col)
			return col->getIslandTag();
	}
	return -1;
}